

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O3

void __thiscall
trackerboy::apu::Hardware::
runAndMixChannel<trackerboy::apu::WaveChannel,(trackerboy::apu::MixMode)2>
          (Hardware *this,size_t index,WaveChannel *ch,Mixer *mixer,uint32_t cycletime,
          uint32_t cycles)

{
  uint8_t uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  char cVar6;
  byte bVar7;
  uint32_t cycletime_00;
  int iVar8;
  uint8_t out;
  
  uVar1 = (ch->super_Channel).mOutput;
  cVar6 = uVar1 - (this->mLastOutputs)._M_elems[index];
  if (cVar6 != '\0') {
    Mixer::mixfast<(trackerboy::apu::MixMode)2>(mixer,cVar6,cycletime);
    (this->mLastOutputs)._M_elems[index] = uVar1;
  }
  uVar3 = (ch->super_Channel).mTimer.mCounter;
  if (uVar3 < cycles || uVar3 - cycles == 0) {
    uVar4 = (ch->super_Channel).mTimer.mPeriod;
    (ch->super_Channel).mTimer.mCounter = uVar4 - (cycles - uVar3) % uVar4;
    iVar8 = (cycles - uVar3) / uVar4 + 1;
    if (iVar8 != 0) {
      cycletime_00 = uVar3 + cycletime;
      do {
        bVar2 = ch->mWaveIndex;
        bVar7 = bVar2 + 1 & 0x1f;
        ch->mWaveIndex = bVar7;
        bVar7 = (ch->mWaveram)._M_elems[bVar7 >> 1];
        bVar5 = bVar7 >> 4;
        if ((bVar2 & 1) == 0) {
          bVar5 = bVar7 & 0xf;
        }
        ch->mSampleBuffer = bVar5;
        bVar5 = bVar5 >> (ch->mVolumeShift & 0x1f);
        (ch->super_Channel).mOutput = bVar5;
        cVar6 = bVar5 - (this->mLastOutputs)._M_elems[index];
        if (cVar6 != '\0') {
          Mixer::mixfast<(trackerboy::apu::MixMode)2>(mixer,cVar6,cycletime_00);
          (this->mLastOutputs)._M_elems[index] = bVar5;
        }
        cycletime_00 = cycletime_00 + uVar4;
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
  }
  else {
    (ch->super_Channel).mTimer.mCounter = uVar3 - cycles;
  }
  return;
}

Assistant:

void Hardware::runAndMixChannel(size_t index, Channel &ch, Mixer &mixer, uint32_t cycletime, uint32_t cycles) noexcept {
    static_assert(mode != MixMode::mute, "cannot mix a muted mode");

    auto &last = mLastOutputs[index];

    auto mixChanges = [&]() {
        // mix any change in output
        if (auto out = ch.output(); out != last) {
            mixer.mixfast<mode>(out - last, cycletime);
            last = out;
        }
    };


    auto &timer = ch.timer();

    mixChanges();
    cycletime += timer.counter();

    // determine the number of clocks we are stepping
    auto clocks = timer.fastforward(cycles);
    auto const period = timer.period();

    // iterate each clock and mix any change in output
    while (clocks) {
        ch.clock();
        --clocks;
        mixChanges();
        cycletime += period;
    }

}